

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

void __thiscall NaDynAr<NaLinearUnit>::item::~item(item *this)

{
  long *in_RDI;
  
  if (*in_RDI == 0) {
    NaPrintLog("data=0x%08p removed twice\n",*in_RDI);
  }
  if ((long *)*in_RDI != (long *)0x0) {
    (**(code **)(*(long *)*in_RDI + 0x10))();
  }
  *in_RDI = 0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }